

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall aiCamera::aiCamera(aiCamera *this)

{
  aiCamera *this_local;
  
  aiString::aiString(&this->mName);
  aiVector3t<float>::aiVector3t(&this->mPosition);
  aiVector3t<float>::aiVector3t(&this->mUp,0.0,1.0,0.0);
  aiVector3t<float>::aiVector3t(&this->mLookAt,0.0,0.0,1.0);
  this->mHorizontalFOV = 0.7853982;
  this->mClipPlaneNear = 0.1;
  this->mClipPlaneFar = 1000.0;
  this->mAspect = 0.0;
  return;
}

Assistant:

aiCamera() AI_NO_EXCEPT
        : mUp               (0.f,1.f,0.f)
        , mLookAt           (0.f,0.f,1.f)
        , mHorizontalFOV    (0.25f * (float)AI_MATH_PI)
        , mClipPlaneNear    (0.1f)
        , mClipPlaneFar     (1000.f)
        , mAspect           (0.f)
    {}